

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int ipc_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int local_3c;
  int rv;
  ipc_ep *ep;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_setopt(ipc_ep_options,name,arg,buf,sz,t);
  if (local_3c == 9) {
    local_3c = nni_stream_listener_set(*(nng_stream_listener **)((long)arg + 0x40),name,buf,sz,t);
  }
  return local_3c;
}

Assistant:

static int
ipc_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_setopt(ipc_ep_options, name, ep, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_listener_set(ep->listener, name, buf, sz, t);
	}
	return (rv);
}